

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_constraint_handler_s.c
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    TESTCASE( _PDCLIB_constraint_handler == abort_handler_s );
    TESTCASE( set_constraint_handler_s( ignore_handler_s ) == abort_handler_s );
    TESTCASE( _PDCLIB_constraint_handler == ignore_handler_s );
    TESTCASE( set_constraint_handler_s( NULL ) == ignore_handler_s );
    TESTCASE( _PDCLIB_constraint_handler == abort_handler_s );
#endif
    return TEST_RESULTS;
}